

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

void nn_sock_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar2;
  char *pcVar3;
  nn_fsm_fn p_Var4;
  ulong uVar5;
  undefined8 uVar6;
  
  uVar5 = (ulong)(uint)src;
  uVar1 = *(uint *)&self[1].fn;
  uVar2 = (ulong)uVar1;
  if (uVar1 == 1) {
    if (src == -2) {
      if (type == 1) {
LAB_0011264c:
        nn_sock_action_zombify((nn_sock *)self);
        return;
      }
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 1;
      uVar5 = 0xfffffffffffffffe;
      uVar6 = 0x3db;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 1;
      uVar6 = 0x3df;
    }
  }
  else if (uVar1 == 2) {
    if (src == 1) {
      if (type == 1) {
        nn_list_erase((nn_list *)&self[3].owner,(nn_list_item *)((long)srcptr + 0x80));
        nn_ep_term((nn_ep *)srcptr);
        nn_free(srcptr);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar5 = 1;
      uVar6 = 0x3fe;
    }
    else {
      if (src != -2) {
        if (type == 0x84c4) {
          p_Var4 = self[1].shutdown_fn;
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var4 + 0x28);
        }
        else {
          if (type != 0x84c3) {
            pcVar3 = "Unexpected action";
            uVar2 = 2;
            uVar6 = 0x40e;
            goto LAB_001127c0;
          }
          p_Var4 = self[1].shutdown_fn;
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var4 + 0x20);
        }
        (*UNRECOVERED_JUMPTABLE)(p_Var4,srcptr);
        return;
      }
      if (type == 1) goto LAB_0011264c;
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar5 = 0xfffffffffffffffe;
      uVar6 = 0x3ee;
    }
  }
  else if (uVar1 == 3) {
    pcVar3 = "Unexpected state";
    uVar2 = 3;
    uVar6 = 0x416;
  }
  else {
    pcVar3 = "Unexpected state";
    uVar6 = 0x41c;
  }
LAB_001127c0:
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,uVar2,uVar5,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/sock.c",
          uVar6);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sock_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    switch (sock->state) {

/******************************************************************************/
/*  INIT state.                                                               */
/******************************************************************************/
    case NN_SOCK_STATE_INIT:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                sock->state = NN_SOCK_STATE_ACTIVE;
                return;
            case NN_SOCK_ACTION_ZOMBIFY:
                nn_sock_action_zombify (sock);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:
            nn_fsm_bad_source (sock->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SOCK_ACTION_ZOMBIFY:
                nn_sock_action_zombify (sock);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        case NN_SOCK_SRC_EP:
            switch (type) {
            case NN_EP_STOPPED:

                /*  This happens when an endpoint is closed using
                    nn_shutdown() function. */
                ep = (struct nn_ep*) srcptr;
                nn_list_erase (&sock->sdeps, &ep->item);
                nn_ep_term (ep);
                nn_free (ep);
                return;

            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:

            /*  The assumption is that all the other events come from pipes. */
            switch (type) {
            case NN_PIPE_IN:
                sock->sockbase->vfptr->in (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            case NN_PIPE_OUT:
                sock->sockbase->vfptr->out (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }
        }

/******************************************************************************/
/*  ZOMBIE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ZOMBIE:
        nn_fsm_bad_state (sock->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sock->state, src, type);
    }
}